

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

Float __thiscall
pbrt::PiecewiseLinearSpectrum::operator()(PiecewiseLinearSpectrum *this,Float lambda)

{
  size_t sVar1;
  float *pfVar2;
  float *pfVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  float fVar10;
  
  sVar1 = (this->lambdas).nStored;
  if (((sVar1 != 0) && (pfVar2 = (this->lambdas).ptr, *pfVar2 <= lambda)) &&
     (lambda <= pfVar2[sVar1 - 1])) {
    uVar5 = sVar1 - 2;
    lVar6 = 1;
    uVar7 = uVar5;
    while (uVar9 = uVar7, 0 < (long)uVar9) {
      uVar7 = uVar9 >> 1;
      if (pfVar2[(int)uVar7 + (int)lVar6] <= lambda) {
        lVar6 = uVar7 + 1 + lVar6;
        uVar7 = ~uVar7 + uVar9;
      }
    }
    if (lVar6 - 1U < uVar5) {
      uVar5 = lVar6 - 1U;
    }
    lVar8 = 0;
    if (0 < lVar6) {
      lVar8 = uVar5 << 0x20;
    }
    lVar6 = lVar8 + 0x100000000 >> 0x1e;
    fVar10 = *(float *)((long)pfVar2 + (lVar8 >> 0x1e));
    pfVar3 = (this->values).ptr;
    fVar10 = (lambda - fVar10) / (*(float *)((long)pfVar2 + lVar6) - fVar10);
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * *(float *)((long)pfVar3 + lVar6))),
                             ZEXT416((uint)(1.0 - fVar10)),
                             ZEXT416(*(uint *)((long)pfVar3 + (lVar8 >> 0x1e))));
    return auVar4._0_4_;
  }
  return 0.0;
}

Assistant:

PBRT_CPU_GPU
    bool empty() const { return size() == 0; }